

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O2

void __thiscall cmCoreTryCompile::FindOutputFile(cmCoreTryCompile *this,string *targetName)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  cmGlobalGenerator *pcVar3;
  string *psVar4;
  string command;
  string outputFileLocation;
  string tmpOutputFile;
  string local_3b8;
  string cfg;
  ifstream ifs;
  size_type local_218;
  
  (this->FindErrorMessage)._M_string_length = 0;
  *(this->FindErrorMessage)._M_dataplus._M_p = '\0';
  (this->OutputFile)._M_string_length = 0;
  *(this->OutputFile)._M_dataplus._M_p = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tmpOutputFile,"/",(allocator<char> *)&ifs);
  std::__cxx11::string::append((string *)&tmpOutputFile);
  pcVar3 = cmMakefile::GetGlobalGenerator(this->Makefile);
  iVar2 = (*pcVar3->_vptr_cmGlobalGenerator[0x28])(pcVar3);
  if ((char)iVar2 != '\0') {
    this_00 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cfg,"CMAKE_TRY_COMPILE_CONFIGURATION",(allocator<char> *)&command);
    psVar4 = cmMakefile::GetSafeDefinition(this_00,&cfg);
    std::__cxx11::string::string((string *)&ifs,(string *)psVar4);
    std::__cxx11::string::~string((string *)&cfg);
    if (local_218 == 0) {
      std::__cxx11::string::string
                ((string *)&cfg,(string *)(anonymous_namespace)::TryCompileDefaultConfig_abi_cxx11_)
      ;
    }
    else {
      cmsys::SystemTools::UpperCase(&cfg,(string *)&ifs);
    }
    outputFileLocation._M_dataplus._M_p._0_1_ = 0x5f;
    cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&>
              (&command,&tmpOutputFile,(char *)&outputFileLocation,&cfg);
    std::__cxx11::string::operator=((string *)&tmpOutputFile,(string *)&command);
    std::__cxx11::string::~string((string *)&command);
    std::__cxx11::string::~string((string *)&cfg);
    std::__cxx11::string::~string((string *)&ifs);
  }
  std::__cxx11::string::append((char *)&tmpOutputFile);
  cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
            (&command,&this->BinaryDirectory,&tmpOutputFile);
  bVar1 = cmsys::SystemTools::FileExists(&command);
  if (bVar1) {
    outputFileLocation._M_dataplus._M_p = (pointer)&outputFileLocation.field_2;
    outputFileLocation._M_string_length = 0;
    outputFileLocation.field_2._M_local_buf[0] = '\0';
    std::ifstream::ifstream(&ifs,command._M_dataplus._M_p,_S_in);
    cmsys::SystemTools::GetLineFromStream
              ((istream *)&ifs,&outputFileLocation,(bool *)0x0,0xffffffffffffffff);
    bVar1 = cmsys::SystemTools::FileExists(&outputFileLocation);
    if (bVar1) {
      cmsys::SystemTools::CollapseFullPath(&cfg,&outputFileLocation);
      std::__cxx11::string::operator=((string *)&this->OutputFile,(string *)&cfg);
      std::__cxx11::string::~string((string *)&cfg);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cfg);
      std::operator<<((ostream *)&cfg,"Recorded try_compile output location doesn\'t exist:\n");
      cmStrCat<char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                (&local_3b8,(char (*) [3])0x714e9e,&outputFileLocation,(char (*) [2])0x75ec3e);
      std::operator<<((ostream *)&cfg,(string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&this->FindErrorMessage,(string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cfg);
    }
    std::ifstream::~ifstream(&ifs);
    std::__cxx11::string::~string((string *)&outputFileLocation);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
    std::operator<<((ostream *)&ifs,"Unable to find the recorded try_compile output location:\n");
    cmStrCat<char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&cfg,(char (*) [3])0x714e9e,&command,(char (*) [2])0x75ec3e);
    std::operator<<((ostream *)&ifs,(string *)&cfg);
    std::__cxx11::string::~string((string *)&cfg);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->FindErrorMessage,(string *)&cfg);
    std::__cxx11::string::~string((string *)&cfg);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
  }
  std::__cxx11::string::~string((string *)&command);
  std::__cxx11::string::~string((string *)&tmpOutputFile);
  return;
}

Assistant:

void cmCoreTryCompile::FindOutputFile(const std::string& targetName)
{
  this->FindErrorMessage.clear();
  this->OutputFile.clear();
  std::string tmpOutputFile = "/";
  tmpOutputFile += targetName;

  if (this->Makefile->GetGlobalGenerator()->IsMultiConfig()) {
    std::string const tcConfig =
      this->Makefile->GetSafeDefinition("CMAKE_TRY_COMPILE_CONFIGURATION");
    std::string const cfg = !tcConfig.empty()
      ? cmSystemTools::UpperCase(tcConfig)
      : TryCompileDefaultConfig;
    tmpOutputFile = cmStrCat(tmpOutputFile, '_', cfg);
  }
  tmpOutputFile += "_loc";

  std::string command = cmStrCat(this->BinaryDirectory, tmpOutputFile);
  if (!cmSystemTools::FileExists(command)) {
    std::ostringstream emsg;
    emsg << "Unable to find the recorded try_compile output location:\n";
    emsg << cmStrCat("  ", command, "\n");
    this->FindErrorMessage = emsg.str();
    return;
  }

  std::string outputFileLocation;
  cmsys::ifstream ifs(command.c_str());
  cmSystemTools::GetLineFromStream(ifs, outputFileLocation);
  if (!cmSystemTools::FileExists(outputFileLocation)) {
    std::ostringstream emsg;
    emsg << "Recorded try_compile output location doesn't exist:\n";
    emsg << cmStrCat("  ", outputFileLocation, "\n");
    this->FindErrorMessage = emsg.str();
    return;
  }

  this->OutputFile = cmSystemTools::CollapseFullPath(outputFileLocation);
}